

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F.cpp
# Opt level: O2

Sequence * __thiscall Finv::operator()(Sequence *__return_storage_ptr__,Finv *this,Sequence *seq)

{
  int iVar1;
  Sequence sbox;
  Sequence tmp;
  Sequence expansion;
  value_type key;
  Sequence local_220;
  Sequence local_1c8;
  Sequence local_170;
  Sequence local_118;
  SequenceD<48> local_c0;
  
  Sequence::permutation(&local_118,seq,&EXPANSION_PERMUTATION);
  iVar1 = this->m_round;
  this->m_round = iVar1 + 1;
  SequenceD<48>::SequenceD
            (&local_c0,
             (this->m_keys).super__Vector_base<SequenceD<48>,_std::allocator<SequenceD<48>_>_>.
             _M_impl.super__Vector_impl_data._M_start + iVar1);
  toSequence<48>(&local_1c8,&local_c0);
  Sequence::operator*(&local_170,&local_118,&local_1c8);
  Sequence::~Sequence(&local_1c8);
  S_function::operator()(&local_220,&this->m_sFunction,&local_170);
  Sequence::permutation(__return_storage_ptr__,&local_220,&PERMUTATION_FUNCTION);
  Sequence::~Sequence(&local_220);
  Sequence::~Sequence(&local_170);
  SequenceD<48>::~SequenceD(&local_c0);
  Sequence::~Sequence(&local_118);
  return __return_storage_ptr__;
}

Assistant:

Sequence Finv::operator()(Sequence &seq) {
    auto expansion = seq.permutation(EXPANSION_PERMUTATION);
    // use the indexed intermediate key
    auto key = m_keys[m_round++];
    auto tmp = expansion * toSequence(key);
    auto sbox = m_sFunction(tmp);
    auto permutation = sbox.permutation(PERMUTATION_FUNCTION);
    return permutation;
}